

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<char,_QByteArray>,_QByteArray>,_char>::
convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<char,_QByteArray>,_QByteArray>,_char> *this)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  iterator d;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->a).a.b.d.size + 2 + (this->a).b.d.size;
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,lVar1,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  local_38 = pcVar2;
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<char,_QByteArray>,_QByteArray>,_char>_>
  ::appendTo<char>(this,&local_38);
  if (lVar1 != (long)local_38 - (long)pcVar2) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }